

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libfsst.cpp
# Opt level: O0

u32 duckdb_fsst_import(duckdb_fsst_decoder_t *decoder,u8 *buf)

{
  u8 auVar1 [8];
  u32 j;
  u32 i;
  u32 l;
  u8 lenHisto [8];
  u32 pos;
  u32 code;
  u64 version;
  u8 *buf_local;
  duckdb_fsst_decoder_t *decoder_local;
  u32 local_4;
  
  pos = 0x11;
  if ((undefined *)(*(ulong *)buf >> 0x20) == &DAT_0134140a) {
    decoder->zeroTerminated = buf[8] & 1;
    auVar1 = *(u8 (*) [8])(buf + 9);
    lenHisto[0] = auVar1[0];
    lenHisto[1] = auVar1[1];
    lenHisto[2] = auVar1[2];
    lenHisto[3] = auVar1[3];
    lenHisto[4] = auVar1[4];
    lenHisto[5] = auVar1[5];
    lenHisto[6] = auVar1[6];
    lenHisto[7] = auVar1[7];
    decoder->len[0] = '\x01';
    decoder->symbol[0] = 0;
    code = (u32)decoder->zeroTerminated;
    if (decoder->zeroTerminated != '\0') {
      lenHisto[0] = auVar1[0];
      lenHisto._1_7_ = auVar1._1_7_;
      lenHisto[0] = lenHisto[0] + 0xff;
    }
    for (l = 1; l < 9; l = l + 1) {
      for (i = 0; i < lenHisto[l & 7]; i = i + 1) {
        decoder->len[code] = ((byte)l & 7) + 1;
        decoder->symbol[code] = 0;
        for (j = 0; j < decoder->len[code]; j = j + 1) {
          *(u8 *)((long)decoder->symbol + (ulong)j + (ulong)code * 8) = buf[pos];
          pos = pos + 1;
        }
        code = code + 1;
      }
    }
    while (code < 0xff) {
      decoder->symbol[code] = 0x74707572726f63;
      decoder->len[code] = '\b';
      code = code + 1;
    }
    local_4 = pos;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

u32 duckdb_fsst_import(duckdb_fsst_decoder_t *decoder, u8 *buf) {
	u64 version = 0;
	u32 code, pos = 17;
	u8 lenHisto[8];

	// version field (first 8 bytes) is now there just for future-proofness, unused still (skipped)
	memcpy(&version, buf, 8);
	if ((version>>32) != FSST_VERSION) return 0;
	decoder->zeroTerminated = buf[8]&1;
	memcpy(lenHisto, buf+9, 8);

	// in case of zero-terminated, first symbol is "" (zero always, may be overwritten)
	decoder->len[0] = 1;
	decoder->symbol[0] = 0;

	// we use lenHisto[0] as 1-byte symbol run length (at the end)
	code = decoder->zeroTerminated;
	if (decoder->zeroTerminated) lenHisto[0]--; // if zeroTerminated, then symbol "" aka 1-byte code=0, is not stored at the end

	// now get all symbols from the buffer
	for(u32 l=1; l<=8; l++) { /* l = 1,2,3,4,5,6,7,8 */
		for(u32 i=0; i < lenHisto[(l&7) /* 1,2,3,4,5,6,7,0 */]; i++, code++)  {
			decoder->len[code] = (l&7)+1; /* len = 2,3,4,5,6,7,8,1  */
			decoder->symbol[code] = 0;
			for(u32 j=0; j<decoder->len[code]; j++)
				((u8*) &decoder->symbol[code])[j] = buf[pos++]; // note this enforces 'little endian' symbols
		}
	}
	if (decoder->zeroTerminated) lenHisto[0]++;

	// fill unused symbols with text "corrupt". Gives a chance to detect corrupted code sequences (if there are unused symbols).
	while(code<255) {
		decoder->symbol[code] = FSST_CORRUPT;
		decoder->len[code++] = 8;
	}
	return pos;
}